

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int luaK_codek(FuncState *fs,int reg,int k)

{
  int iVar1;
  
  if (k < 0x20000) {
    iVar1 = luaK_codeABx(fs,OP_LOADK,reg,k);
    return iVar1;
  }
  luaK_code(fs,reg << 7 | 4);
  iVar1 = codeextraarg(fs,k);
  return iVar1;
}

Assistant:

static int luaK_codek (FuncState *fs, int reg, int k) {
  if (k <= MAXARG_Bx)
    return luaK_codeABx(fs, OP_LOADK, reg, k);
  else {
    int p = luaK_codeABx(fs, OP_LOADKX, reg, 0);
    codeextraarg(fs, k);
    return p;
  }
}